

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OldAccumulator.hpp
# Opt level: O0

void __thiscall OpenMD::Accumulator::add(Accumulator *this,ElementType *val)

{
  size_t sVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  ElementType local_28;
  ElementType local_20;
  ElementType *val_local;
  Accumulator *this_local;
  
  (this->super_BaseAccumulator).Count_ = (this->super_BaseAccumulator).Count_ + 1;
  sVar1 = (this->super_BaseAccumulator).Count_;
  auVar3._8_4_ = (int)(sVar1 >> 0x20);
  auVar3._0_8_ = sVar1;
  auVar3._12_4_ = 0x45300000;
  this->Avg_ = this->Avg_ +
               (*val - this->Avg_) /
               ((auVar3._8_8_ - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,(int)sVar1) - 4503599627370496.0));
  sVar1 = (this->super_BaseAccumulator).Count_;
  auVar2._8_4_ = (int)(sVar1 >> 0x20);
  auVar2._0_8_ = sVar1;
  auVar2._12_4_ = 0x45300000;
  this->Avg2_ = (*val * *val - this->Avg2_) /
                ((auVar2._8_8_ - 1.9342813113834067e+25) +
                ((double)CONCAT44(0x43300000,(int)sVar1) - 4503599627370496.0)) + this->Avg2_;
  this->Val_ = *val;
  this->Total_ = *val + this->Total_;
  if ((this->super_BaseAccumulator).Count_ < 2) {
    this->Max_ = *val;
    this->Min_ = *val;
  }
  else {
    if (*val < this->Max_ || *val == this->Max_) {
      local_20 = this->Max_;
    }
    else {
      local_20 = *val;
    }
    this->Max_ = local_20;
    if (this->Min_ <= *val) {
      local_28 = this->Min_;
    }
    else {
      local_28 = *val;
    }
    this->Min_ = local_28;
  }
  return;
}

Assistant:

virtual void add(ElementType const& val) {
      Count_++;
      Avg_ += (val - Avg_) / Count_;
      Avg2_ += (val * val - Avg2_) / Count_;
      Val_ = val;
      Total_ += val;
      if (Count_ <= 1) {
        Max_ = val;
        Min_ = val;
      } else {
        Max_ = val > Max_ ? val : Max_;
        Min_ = val < Min_ ? val : Min_;
      }
    }